

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmXMLWriter.cxx
# Opt level: O2

void __thiscall cmXMLWriter::ConditionalLineBreak(cmXMLWriter *this,bool condition,size_t indent)

{
  undefined7 in_register_00000031;
  size_t i;
  ulong uVar1;
  
  if ((int)CONCAT71(in_register_00000031,condition) != 0) {
    std::operator<<(this->Output,'\n');
    for (uVar1 = 0; uVar1 < this->Level + indent; uVar1 = uVar1 + 1) {
      std::operator<<(this->Output,(string *)&this->IndentationElement);
    }
  }
  return;
}

Assistant:

void cmXMLWriter::ConditionalLineBreak(bool condition, std::size_t indent)
{
  if (condition) {
    this->Output << '\n';
    for (std::size_t i = 0; i < indent + this->Level; ++i) {
      this->Output << this->IndentationElement;
    }
  }
}